

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::MarkAsIgnored::MarkAsIgnored(MarkAsIgnored *this,char *test_suite)

{
  char *pcVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_39;
  value_type local_38;
  char *local_18;
  char *test_suite_local;
  MarkAsIgnored *this_local;
  
  local_18 = test_suite;
  test_suite_local = (char *)this;
  this_00 = GetIgnoredParameterizedTestSuites_abi_cxx11_();
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

MarkAsIgnored::MarkAsIgnored(const char* test_suite) {
  GetIgnoredParameterizedTestSuites()->insert(test_suite);
}